

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::StddevState,double,duckdb::VarSampOperation>
               (double *idata,AggregateInputData *aggr_input_data,StddevState **states,
               SelectionVector *isel,SelectionVector *ssel,ValidityMask *mask,idx_t count)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t i;
  ulong uVar4;
  idx_t i_1;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = uVar4;
      if (isel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)isel->sel_vector[uVar4];
      }
      uVar3 = uVar4;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)ssel->sel_vector[uVar4];
      }
      STDDevBaseOperation::Execute<double,duckdb::StddevState>(states[uVar3],idata + uVar2);
    }
  }
  else {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = uVar4;
      if (isel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)isel->sel_vector[uVar4];
      }
      uVar3 = uVar4;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)ssel->sel_vector[uVar4];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,uVar2);
      if (bVar1) {
        STDDevBaseOperation::Execute<double,duckdb::StddevState>(states[uVar3],idata + uVar2);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}